

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj2pbrt.cpp
# Opt level: O2

uint tinyobj::updateVertex
               (map<tinyobj::vertex_index,_unsigned_int,_std::less<tinyobj::vertex_index>,_std::allocator<std::pair<const_tinyobj::vertex_index,_unsigned_int>_>_>
                *vertexCache,vector<float,_std::allocator<float>_> *positions,
               vector<float,_std::allocator<float>_> *normals,
               vector<float,_std::allocator<float>_> *texcoords,
               vector<float,_std::allocator<float>_> *in_positions,
               vector<float,_std::allocator<float>_> *in_normals,
               vector<float,_std::allocator<float>_> *in_texcoords,vertex_index *i)

{
  pointer pfVar1;
  iterator iVar2;
  mapped_type_conflict *pmVar3;
  uint uVar4;
  
  iVar2 = std::
          _Rb_tree<tinyobj::vertex_index,_std::pair<const_tinyobj::vertex_index,_unsigned_int>,_std::_Select1st<std::pair<const_tinyobj::vertex_index,_unsigned_int>_>,_std::less<tinyobj::vertex_index>,_std::allocator<std::pair<const_tinyobj::vertex_index,_unsigned_int>_>_>
          ::find(&vertexCache->_M_t,i);
  if ((_Rb_tree_header *)iVar2._M_node == &(vertexCache->_M_t)._M_impl.super__Rb_tree_header) {
    std::vector<float,_std::allocator<float>_>::push_back
              (positions,
               (in_positions->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start + (long)i->v_idx * 3);
    std::vector<float,_std::allocator<float>_>::push_back
              (positions,
               (in_positions->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start + (long)i->v_idx * 3 + 1);
    std::vector<float,_std::allocator<float>_>::push_back
              (positions,
               (in_positions->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start + (long)i->v_idx * 3 + 2);
    uVar4 = i->vn_idx;
    if ((-1 < (int)uVar4) &&
       (pfVar1 = (in_normals->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start,
       (ulong)uVar4 * 3 + 2 <
       (ulong)((long)(in_normals->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pfVar1 >> 2))) {
      std::vector<float,_std::allocator<float>_>::push_back(normals,pfVar1 + (ulong)uVar4 * 3);
      std::vector<float,_std::allocator<float>_>::push_back
                (normals,(in_normals->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                         super__Vector_impl_data._M_start + (long)i->vn_idx * 3 + 1);
      std::vector<float,_std::allocator<float>_>::push_back
                (normals,(in_normals->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                         super__Vector_impl_data._M_start + (long)i->vn_idx * 3 + 2);
    }
    uVar4 = i->vt_idx;
    if (-1 < (int)uVar4) {
      pfVar1 = (in_texcoords->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)uVar4 * 2 + 1 <
          (ulong)((long)(in_texcoords->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)pfVar1 >> 2)) {
        std::vector<float,_std::allocator<float>_>::push_back(texcoords,pfVar1 + uVar4 * 2);
        std::vector<float,_std::allocator<float>_>::push_back
                  (texcoords,
                   (in_texcoords->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_start + (long)i->vt_idx * 2 + 1);
      }
    }
    uVar4 = (int)((ulong)((long)(positions->super__Vector_base<float,_std::allocator<float>_>).
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)(positions->super__Vector_base<float,_std::allocator<float>_>).
                                _M_impl.super__Vector_impl_data._M_start >> 2) / 3) - 1;
    pmVar3 = std::
             map<tinyobj::vertex_index,_unsigned_int,_std::less<tinyobj::vertex_index>,_std::allocator<std::pair<const_tinyobj::vertex_index,_unsigned_int>_>_>
             ::operator[](vertexCache,i);
    *pmVar3 = uVar4;
  }
  else {
    uVar4 = *(uint *)((long)&iVar2._M_node[1]._M_parent + 4);
  }
  return uVar4;
}

Assistant:

static unsigned int
updateVertex(std::map<vertex_index, unsigned int> &vertexCache,
             std::vector<float> &positions, std::vector<float> &normals,
             std::vector<float> &texcoords,
             const std::vector<float> &in_positions,
             const std::vector<float> &in_normals,
             const std::vector<float> &in_texcoords, const vertex_index &i) {
  const std::map<vertex_index, unsigned int>::iterator it = vertexCache.find(i);

  if (it != vertexCache.end()) {
    // found cache
    return it->second;
  }

  assert(in_positions.size() > static_cast<unsigned int>(3 * i.v_idx + 2));

  positions.push_back(in_positions[3 * static_cast<size_t>(i.v_idx) + 0]);
  positions.push_back(in_positions[3 * static_cast<size_t>(i.v_idx) + 1]);
  positions.push_back(in_positions[3 * static_cast<size_t>(i.v_idx) + 2]);

  if ((i.vn_idx >= 0) &&
      (static_cast<size_t>(i.vn_idx * 3 + 2) < in_normals.size())) {
    normals.push_back(in_normals[3 * static_cast<size_t>(i.vn_idx) + 0]);
    normals.push_back(in_normals[3 * static_cast<size_t>(i.vn_idx) + 1]);
    normals.push_back(in_normals[3 * static_cast<size_t>(i.vn_idx) + 2]);
  }

  if ((i.vt_idx >= 0) &&
      (static_cast<size_t>(i.vt_idx * 2 + 1) < in_texcoords.size())) {
    texcoords.push_back(in_texcoords[2 * static_cast<size_t>(i.vt_idx) + 0]);
    texcoords.push_back(in_texcoords[2 * static_cast<size_t>(i.vt_idx) + 1]);
  }

  unsigned int idx = static_cast<unsigned int>(positions.size() / 3 - 1);
  vertexCache[i] = idx;

  return idx;
}